

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parse(Parser *this,Tokenizer *tokenizer,bool virtualFile,path *name)

{
  _List_node_base **pp_Var1;
  iterator __position;
  bool bVar2;
  size_t sVar3;
  undefined7 in_register_00000011;
  path *in_R8;
  FileEntry entry;
  FileEntry local_38;
  
  local_38.tokenizer = (Tokenizer *)CONCAT71(in_register_00000011,virtualFile);
  if ((ulong)(((long)(tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl.
                     _M_node.super__List_node_base._M_prev -
               (long)(tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl.
                     _M_node.super__List_node_base._M_next >> 3) * -0x5555555555555555) < 0x96) {
    local_38.virtualFile = SUB81(name,0);
    if ((SUB81(name,0) != false) || (bVar2 = ghc::filesystem::path::empty(in_R8), bVar2)) {
      local_38.fileNum = -1;
    }
    else {
      sVar3 = FileList::size(&Global.fileList);
      local_38.fileNum = (int)sVar3;
      FileList::add(&Global.fileList,in_R8);
    }
    __position._M_current =
         (FileEntry *)
         (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
         super__List_node_base._M_prev;
    if (__position._M_current ==
        (FileEntry *)
        (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node._M_size)
    {
      std::vector<Parser::FileEntry,std::allocator<Parser::FileEntry>>::
      _M_realloc_insert<Parser::FileEntry_const&>
                ((vector<Parser::FileEntry,std::allocator<Parser::FileEntry>> *)tokenizer,__position
                 ,&local_38);
    }
    else {
      (__position._M_current)->previousCommandLine = local_38.previousCommandLine;
      *(undefined4 *)&(__position._M_current)->field_0x14 = local_38._20_4_;
      (__position._M_current)->tokenizer = local_38.tokenizer;
      (__position._M_current)->virtualFile = (bool)local_38.virtualFile;
      *(int3 *)&(__position._M_current)->field_0x9 = local_38._9_3_;
      (__position._M_current)->fileNum = local_38.fileNum;
      pp_Var1 = &(tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node
                 .super__List_node_base._M_prev;
      *pp_Var1 = (_List_node_base *)&(*pp_Var1)[1]._M_prev;
    }
    parseCommandSequence(this,(char)tokenizer,(initializer_list<const_char_*>)ZEXT816(0));
    pp_Var1 = &(tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
               super__List_node_base._M_prev;
    *pp_Var1 = (_List_node_base *)&(*pp_Var1)[-2]._M_prev;
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           this;
  }
  Logger::queueError<>(Error,"Max include/recursion depth reached");
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parse(Tokenizer* tokenizer, bool virtualFile, const fs::path& name)
{
	if (entries.size() >= 150)
	{
		Logger::queueError(Logger::Error, "Max include/recursion depth reached");
		return nullptr;
	}

	FileEntry entry;
	entry.tokenizer = tokenizer;
	entry.virtualFile = virtualFile;

	if (!virtualFile && !name.empty())
	{
		entry.fileNum = (int) Global.fileList.size();
		Global.fileList.add(name);
	} else {
		entry.fileNum = -1;
	}

	entries.push_back(entry);

	std::unique_ptr<CAssemblerCommand> sequence = parseCommandSequence();
	entries.pop_back();

	return sequence;
}